

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pragmaVtabConnect(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr
                     )

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  sqlite3_vtab *psVar4;
  undefined8 uVar5;
  long lVar6;
  char cVar7;
  sqlite3_str local_118;
  char zBuf [200];
  
  local_118.zText = zBuf;
  local_118.db = (sqlite3 *)0x0;
  local_118.nAlloc = 200;
  local_118.mxAlloc = 0;
  local_118.nChar = 0;
  local_118.accError = '\0';
  local_118.printfFlags = '\0';
  sqlite3_str_appendall(&local_118,"CREATE TABLE x");
  bVar1 = *(byte *)((long)pAux + 10);
  uVar5 = 0x28;
  for (lVar6 = 0; (uint)lVar6 < (uint)*(byte *)((long)pAux + 0xb); lVar6 = lVar6 + 1) {
    sqlite3_str_appendf(&local_118,"%c\"%s\"",uVar5,pragCName[lVar6 + (ulong)bVar1]);
    uVar5 = 0x2c;
  }
  if ((uint)lVar6 == 0) {
    lVar6 = 1;
    sqlite3_str_appendf(&local_118,"(\"%s\"",*pAux);
  }
  bVar1 = *(byte *)((long)pAux + 9);
  cVar7 = (bVar1 & 0x20) != 0;
  if ((bool)cVar7) {
    sqlite3_str_appendall(&local_118,",arg HIDDEN");
    bVar1 = *(byte *)((long)pAux + 9);
  }
  if (0x3f < bVar1) {
    sqlite3_str_appendall(&local_118,",schema HIDDEN");
    cVar7 = cVar7 + '\x01';
  }
  sqlite3_str_append(&local_118,")",1);
  sqlite3StrAccumFinish(&local_118);
  iVar2 = sqlite3_declare_vtab(db,zBuf);
  if (iVar2 == 0) {
    psVar4 = (sqlite3_vtab *)sqlite3_malloc(0x30);
    iVar2 = 0;
    if (psVar4 == (sqlite3_vtab *)0x0) {
      iVar2 = 7;
      psVar4 = (sqlite3_vtab *)0x0;
    }
    else {
      *(undefined8 *)&psVar4[1].nRef = 0;
      psVar4[1].zErrMsg = (char *)0x0;
      psVar4->zErrMsg = (char *)0x0;
      psVar4[1].pModule = (sqlite3_module *)0x0;
      psVar4->pModule = (sqlite3_module *)0x0;
      *(undefined8 *)&psVar4->nRef = 0;
      *(void **)&psVar4[1].nRef = pAux;
      psVar4[1].pModule = (sqlite3_module *)db;
      *(char *)((long)&psVar4[1].zErrMsg + 1) = (char)lVar6;
      *(char *)&psVar4[1].zErrMsg = cVar7;
    }
  }
  else {
    pcVar3 = sqlite3_errmsg(db);
    psVar4 = (sqlite3_vtab *)0x0;
    pcVar3 = sqlite3_mprintf("%s",pcVar3);
    *pzErr = pcVar3;
  }
  *ppVtab = psVar4;
  return iVar2;
}

Assistant:

static int pragmaVtabConnect(
  sqlite3 *db,
  void *pAux,
  int argc, const char *const*argv,
  sqlite3_vtab **ppVtab,
  char **pzErr
){
  const PragmaName *pPragma = (const PragmaName*)pAux;
  PragmaVtab *pTab = 0;
  int rc;
  int i, j;
  char cSep = '(';
  StrAccum acc;
  char zBuf[200];

  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);
  sqlite3StrAccumInit(&acc, 0, zBuf, sizeof(zBuf), 0);
  sqlite3_str_appendall(&acc, "CREATE TABLE x");
  for(i=0, j=pPragma->iPragCName; i<pPragma->nPragCName; i++, j++){
    sqlite3_str_appendf(&acc, "%c\"%s\"", cSep, pragCName[j]);
    cSep = ',';
  }
  if( i==0 ){
    sqlite3_str_appendf(&acc, "(\"%s\"", pPragma->zName);
    i++;
  }
  j = 0;
  if( pPragma->mPragFlg & PragFlg_Result1 ){
    sqlite3_str_appendall(&acc, ",arg HIDDEN");
    j++;
  }
  if( pPragma->mPragFlg & (PragFlg_SchemaOpt|PragFlg_SchemaReq) ){
    sqlite3_str_appendall(&acc, ",schema HIDDEN");
    j++;
  }
  sqlite3_str_append(&acc, ")", 1);
  sqlite3StrAccumFinish(&acc);
  assert( strlen(zBuf) < sizeof(zBuf)-1 );
  rc = sqlite3_declare_vtab(db, zBuf);
  if( rc==SQLITE_OK ){
    pTab = (PragmaVtab*)sqlite3_malloc(sizeof(PragmaVtab));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pTab, 0, sizeof(PragmaVtab));
      pTab->pName = pPragma;
      pTab->db = db;
      pTab->iHidden = i;
      pTab->nHidden = j;
    }
  }else{
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }

  *ppVtab = (sqlite3_vtab*)pTab;
  return rc;
}